

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  exception *e;
  string local_7d8 [32];
  result_t local_7b8;
  undefined1 local_750 [8];
  ExttposeArgument args;
  undefined1 local_5f8 [8];
  Env env;
  char **argv_local;
  int argc_local;
  
  env._1496_8_ = argv;
  Env::Env((Env *)local_5f8);
  ExttposeArgument::ExttposeArgument((ExttposeArgument *)local_750);
  ExttposeArgument::parse_args((ExttposeArgument *)local_750,argc,(char **)env._1496_8_);
  exttposeFunc(&local_7b8,(Env *)local_5f8,(ExttposeArgument *)local_750);
  result_t::~result_t(&local_7b8);
  std::__cxx11::ostringstream::str();
  poVar1 = std::operator<<((ostream *)&std::cout,local_7d8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::ostringstream::str();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&e);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&e);
  ExttposeArgument::~ExttposeArgument((ExttposeArgument *)local_750);
  Env::~Env((Env *)local_5f8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    try {
        Env env;
        ExttposeArgument args;
        args.parse_args(argc, argv);
        exttposeFunc(env, args);
        cout << env.logger.str() << endl;
        cout << env.summary.str() << endl;
        return 0;
    }
    catch (exception &e) {
        cerr << "exttpose: Caught exception: " << e.what() << endl;
    }
    catch (...) {
        cerr << "exttpose: Caught unknown exception" << endl;
    }
    return 1;
}